

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

void __thiscall bidfx_public_api::tools::Date::Date(Date *this,int year,int month,int day)

{
  bool bVar1;
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string error;
  
  bVar1 = IsValidDate(this,year,month,day);
  if (bVar1) {
    this->year_ = year;
    this->month_ = month;
    this->day_ = day;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&error,"Date is invalid: ",(allocator<char> *)&local_80);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  ToString_abi_cxx11_(&local_60,this);
  std::operator+(&local_80,&error,&local_60);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_80);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Date::Date(int year, int month, int day)
{
    if (IsValidDate(year, month, day))
    {
        year_ = year;
        month_ = month;
        day_ = day;
    }
    else
    {
        std::string error = "Date is invalid: ";

        throw std::invalid_argument(error + ToString());
    }
}